

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O2

void glcts::fillData<unsigned_int>
               (uint *data,GLuint width,GLuint height,GLuint depth,GLuint components,uint base)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  GLuint k;
  GLuint GVar6;
  GLuint GVar7;
  GLuint j;
  GLuint GVar8;
  bool bVar9;
  
  uVar4 = 0;
  for (GVar7 = 0; GVar7 != depth; GVar7 = GVar7 + 1) {
    uVar3 = uVar4;
    for (GVar8 = 0; GVar8 != width; GVar8 = GVar8 + 1) {
      uVar2 = uVar3;
      for (GVar6 = 0; uVar1 = (ulong)components, uVar5 = uVar2, GVar6 != height; GVar6 = GVar6 + 1)
      {
        while( true ) {
          bVar9 = uVar1 == 0;
          uVar1 = uVar1 - 1;
          if (bVar9) break;
          data[uVar5] = GVar7 + base;
          uVar5 = uVar5 + 1;
        }
        uVar2 = uVar2 + components;
      }
      uVar3 = uVar3 + components * height;
    }
    uVar4 = uVar4 + components * height * width;
  }
  return;
}

Assistant:

void fillData(T* data, glw::GLuint width, glw::GLuint height, glw::GLuint depth, glw::GLuint components, T base)
{
	for (glw::GLuint i = 0; i < depth; ++i)
	{
		for (glw::GLuint j = 0; j < width; ++j)
		{
			for (glw::GLuint k = 0; k < height; ++k)
			{
				for (glw::GLuint l = 0; l < components; ++l)
				{
					data[i * width * height * components + j * height * components + k * components + l] = base + (T)i;
				}
			}
		}
	}
}